

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synthesis.cpp
# Opt level: O3

void Synthesis(double *f0,int f0_length,double **spectrogram,double **aperiodicity,int fft_size,
              double frame_period,int fs,int y_length,double *y)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  fft_plan p;
  fft_plan p_00;
  fft_plan p_01;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int i;
  uint uVar6;
  int iVar7;
  int iVar8;
  void *pvVar9;
  void *pvVar10;
  void *pvVar11;
  void *pvVar12;
  double *yi;
  double *pdVar13;
  double *pdVar14;
  double *pdVar15;
  double *pdVar16;
  double *pdVar17;
  double *pdVar18;
  void *pvVar19;
  void *pvVar20;
  int iVar21;
  long lVar22;
  uint uVar23;
  size_t __n;
  ulong uVar24;
  int iVar25;
  undefined8 *puVar26;
  size_t sVar27;
  undefined8 *puVar28;
  int current_frame_floor;
  uint uVar29;
  int iVar30;
  int iVar31;
  ulong uVar32;
  int i_1;
  ulong uVar33;
  byte bVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  double dVar41;
  ulong uVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double interpolation;
  double dVar46;
  RandnState randn_state;
  InverseRealFFT inverse_real_fft;
  MinimumPhaseAnalysis minimum_phase;
  ForwardRealFFT forward_real_fft;
  undefined8 auStackY_328 [5];
  undefined1 in_stack_fffffffffffffd00 [40];
  int iVar47;
  undefined4 uVar48;
  double *in_stack_fffffffffffffd40;
  RandnState local_1b8;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  MinimumPhaseAnalysis local_148;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  bVar34 = 0;
  uVar3 = (ulong)(uint)fft_size;
  local_1b8.g_randn_x = 0;
  local_1b8.g_randn_y = 0;
  local_1b8.g_randn_z = 0;
  local_1b8.g_randn_w = 0;
  randn_reseed(&local_1b8);
  uVar48 = 0;
  sVar27 = uVar3 * 8;
  if (fft_size < 0) {
    sVar27 = 0xffffffffffffffff;
  }
  pvVar9 = operator_new__(sVar27);
  __n = (ulong)(uint)y_length * 8;
  if (0 < y_length) {
    memset(y,0,__n);
  }
  if (y_length < 0) {
    __n = 0xffffffffffffffff;
  }
  uVar33 = (long)y_length * 4;
  if (y_length < 0) {
    uVar33 = 0xffffffffffffffff;
  }
  uVar32 = (long)y_length << 3;
  if (y_length < 0) {
    uVar32 = 0xffffffffffffffff;
  }
  memset(&local_148,0,0xb0);
  iVar47 = fft_size;
  InitializeMinimumPhaseAnalysis(fft_size,&local_148);
  local_1a8 = (undefined1  [16])0x0;
  local_198 = (undefined1  [16])0x0;
  local_188 = (undefined1  [16])0x0;
  local_178 = (undefined1  [16])0x0;
  local_168 = (undefined1  [16])0x0;
  local_158 = (undefined1  [16])0x0;
  InitializeInverseRealFFT(fft_size,(InverseRealFFT *)local_1a8);
  local_98 = (undefined1  [16])0x0;
  local_88 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  local_68 = (undefined1  [16])0x0;
  local_58 = (undefined1  [16])0x0;
  local_48 = (undefined1  [16])0x0;
  InitializeForwardRealFFT(fft_size,(ForwardRealFFT *)local_98);
  pvVar10 = operator_new__(uVar32);
  pvVar11 = operator_new__(uVar33);
  pvVar12 = operator_new__(uVar32);
  yi = (double *)operator_new__(uVar32);
  pdVar13 = (double *)operator_new__(__n);
  uVar32 = (ulong)(f0_length + 1);
  uVar33 = uVar32 * 8;
  if (f0_length < -1) {
    uVar33 = 0xffffffffffffffff;
  }
  pdVar14 = (double *)operator_new__(uVar33);
  iVar31 = (int)uVar32;
  pdVar15 = (double *)operator_new__(uVar33);
  pdVar16 = (double *)operator_new__(uVar33);
  auVar5 = _DAT_0010c240;
  auVar4 = _DAT_0010c230;
  dVar46 = (double)fs;
  if (0 < y_length) {
    lVar22 = (ulong)(uint)y_length - 1;
    auVar39._8_4_ = (int)lVar22;
    auVar39._0_8_ = lVar22;
    auVar39._12_4_ = (int)((ulong)lVar22 >> 0x20);
    uVar33 = 0;
    auVar39 = auVar39 ^ _DAT_0010c230;
    auVar40 = _DAT_0010c220;
    do {
      bVar2 = auVar39._0_4_ < SUB164(auVar40 ^ auVar4,0);
      iVar7 = auVar39._4_4_;
      iVar21 = SUB164(auVar40 ^ auVar4,4);
      if ((bool)(~(iVar7 < iVar21 || iVar21 == iVar7 && bVar2) & 1)) {
        pdVar13[uVar33] = (double)(int)uVar33 / dVar46;
      }
      if (iVar7 >= iVar21 && (iVar21 != iVar7 || !bVar2)) {
        pdVar13[uVar33 + 1] = (double)((int)uVar33 + 1) / dVar46;
      }
      uVar33 = uVar33 + 2;
      lVar22 = auVar40._8_8_;
      auVar40._0_8_ = auVar40._0_8_ + auVar5._0_8_;
      auVar40._8_8_ = lVar22 + auVar5._8_8_;
    } while ((y_length + 1U & 0xfffffffe) != uVar33);
  }
  dVar45 = frame_period / 1000.0;
  if (0 < f0_length) {
    uVar33 = 0;
    do {
      pdVar14[uVar33] = (double)(int)uVar33 * dVar45;
      dVar44 = (double)(~-(ulong)(f0[uVar33] < (double)(fs / fft_size) + 1.0) & (ulong)f0[uVar33]);
      pdVar15[uVar33] = dVar44;
      pdVar16[uVar33] = (double)(~-(ulong)(dVar44 == 0.0) & 0x3ff0000000000000);
      uVar33 = uVar33 + 1;
    } while ((uint)f0_length != uVar33);
  }
  pdVar14[f0_length] = (double)f0_length * dVar45;
  pdVar15[f0_length] =
       (pdVar15[(long)f0_length + -1] + pdVar15[(long)f0_length + -1]) -
       pdVar15[(long)f0_length + -2];
  pdVar16[f0_length] =
       (pdVar16[(long)f0_length + -1] + pdVar16[(long)f0_length + -1]) -
       pdVar16[(long)f0_length + -2];
  pdVar17 = (double *)operator_new__(__n);
  interp1(pdVar14,pdVar15,iVar31,pdVar13,y_length,pdVar17);
  interp1(pdVar14,pdVar16,iVar31,pdVar13,y_length,yi);
  if (0 < y_length) {
    uVar33 = 0;
    do {
      dVar44 = (double)(-(ulong)(0.5 < yi[uVar33]) & 0x3ff0000000000000);
      yi[uVar33] = dVar44;
      if ((dVar44 != 0.0) || (dVar35 = 500.0, NAN(dVar44))) {
        dVar35 = pdVar17[uVar33];
      }
      pdVar17[uVar33] = dVar35;
      uVar33 = uVar33 + 1;
    } while ((uint)y_length != uVar33);
  }
  pdVar18 = (double *)operator_new__(__n);
  uVar33 = 0xffffffffffffffff;
  if (0 < y_length) {
    uVar33 = (ulong)(y_length - 1) * 8;
  }
  pvVar19 = operator_new__(uVar33);
  dVar44 = (*pdVar17 * 6.283185307179586) / dVar46;
  dVar35 = fmod(dVar44,6.283185307179586);
  *pdVar18 = dVar35;
  uVar29 = 0;
  if (1 < y_length) {
    lVar22 = 0;
    do {
      dVar44 = dVar44 + (pdVar17[lVar22 + 1] * 6.283185307179586) / dVar46;
      dVar36 = dVar35;
      dVar35 = fmod(dVar44,6.283185307179586);
      pdVar18[lVar22 + 1] = dVar35;
      *(double *)((long)pvVar19 + lVar22 * 8) = ABS(dVar35 - dVar36);
      lVar22 = lVar22 + 1;
    } while ((ulong)(uint)y_length - 1 != lVar22);
    uVar33 = 0;
    uVar32 = (ulong)DAT_0010c250;
    uVar29 = 0;
    do {
      if (3.141592653589793 < *(double *)((long)pvVar19 + uVar33 * 8)) {
        lVar22 = (long)(int)uVar29;
        *(double *)((long)pvVar10 + lVar22 * 8) = pdVar13[uVar33];
        *(int *)((long)pvVar11 + lVar22 * 4) = (int)uVar33;
        *(double *)((long)pvVar12 + lVar22 * 8) =
             ((double)((ulong)(pdVar18[uVar33] + -6.283185307179586) ^ uVar32) /
             (pdVar18[uVar33 + 1] - (pdVar18[uVar33] + -6.283185307179586))) / dVar46;
        uVar29 = uVar29 + 1;
      }
      uVar33 = uVar33 + 1;
    } while (y_length - 1 != uVar33);
  }
  operator_delete__(pvVar19);
  operator_delete__(pdVar18);
  operator_delete__(pdVar16);
  operator_delete__(pdVar15);
  operator_delete__(pdVar14);
  operator_delete__(pdVar13);
  operator_delete__(pdVar17);
  pvVar19 = operator_new__(sVar27);
  uVar6 = (int)(((uint)(CONCAT44(uVar48,iVar47) >> 0x1f) & 1) + iVar47) >> 1;
  uVar33 = (ulong)uVar6;
  if (1 < iVar47) {
    dVar44 = (double)(iVar47 + 1);
    pdVar13 = (double *)((long)pvVar19 + uVar3 * 8);
    dVar35 = 0.0;
    uVar32 = 0;
    do {
      pdVar13 = pdVar13 + -1;
      uVar24 = uVar32 + 1;
      dVar36 = cos(((double)(int)uVar24 * 6.283185307179586) / dVar44);
      dVar36 = dVar36 * -0.5 + 0.5;
      *(double *)((long)pvVar19 + uVar32 * 8) = dVar36;
      *pdVar13 = dVar36;
      dVar36 = *(double *)((long)pvVar19 + uVar32 * 8);
      dVar35 = dVar35 + dVar36 + dVar36;
      uVar32 = uVar24;
    } while (uVar33 != uVar24);
    pdVar13 = (double *)((long)pvVar19 + uVar3 * 8);
    uVar32 = 0;
    do {
      pdVar13 = pdVar13 + -1;
      dVar44 = *(double *)((long)pvVar19 + uVar32 * 8) / dVar35;
      *(double *)((long)pvVar19 + uVar32 * 8) = dVar44;
      *pdVar13 = dVar44;
      uVar32 = uVar32 + 1;
    } while (uVar33 != uVar32);
  }
  if (0 < (int)uVar29) {
    iVar7 = f0_length + -1;
    uVar24 = (ulong)(uVar6 + 1);
    uVar32 = 0;
    iVar31 = iVar47;
    do {
      iVar21 = *(int *)((long)pvVar11 + uVar32 * 4);
      dVar44 = *(double *)((long)pvVar10 + uVar32 * 8);
      uVar1 = uVar32 + 1;
      uVar42 = uVar1;
      if ((int)(uVar29 - 1) < (int)uVar1) {
        uVar42 = (ulong)(uVar29 - 1);
      }
      dVar35 = *(double *)((long)pvVar12 + uVar32 * 8);
      iVar25 = *(int *)((long)pvVar11 + (long)(int)uVar42 * 4);
      dVar36 = yi[iVar21];
      pdVar13 = (double *)operator_new__(sVar27);
      pdVar14 = (double *)operator_new__(sVar27);
      pvVar20 = operator_new__(sVar27);
      pdVar15 = (double *)operator_new__(sVar27);
      dVar44 = dVar44 / dVar45;
      dVar37 = floor(dVar44);
      iVar30 = (int)dVar37;
      if (iVar7 < (int)dVar37) {
        iVar30 = iVar7;
      }
      dVar37 = ceil(dVar44);
      iVar8 = (int)dVar37;
      if (iVar7 < (int)dVar37) {
        iVar8 = iVar7;
      }
      dVar37 = dVar44 - (double)iVar30;
      if (iVar30 == iVar8) {
        if (-2 < iVar31) {
          pdVar16 = spectrogram[iVar30];
          uVar32 = 0;
          do {
            *(double *)((long)pvVar20 + uVar32 * 8) = ABS(pdVar16[uVar32]);
            uVar32 = uVar32 + 1;
          } while (uVar24 != uVar32);
LAB_0010a711:
          if (iVar30 == iVar8) {
            if (-2 < iVar31) {
              pdVar16 = aperiodicity[iVar30];
              uVar32 = 0;
              do {
                dVar37 = 0.999999999999;
                if (pdVar16[uVar32] <= 0.999999999999) {
                  dVar37 = pdVar16[uVar32];
                }
                dVar38 = 0.001;
                if (0.001 <= dVar37) {
                  dVar38 = dVar37;
                }
                pdVar15[uVar32] = dVar38 * dVar38;
                uVar32 = uVar32 + 1;
              } while (uVar24 != uVar32);
            }
          }
          else if (-2 < iVar31) {
            pdVar16 = aperiodicity[iVar30];
            pdVar17 = aperiodicity[iVar8];
            uVar32 = 0;
            do {
              dVar38 = 0.999999999999;
              if (pdVar16[uVar32] <= 0.999999999999) {
                dVar38 = pdVar16[uVar32];
              }
              dVar41 = 0.001;
              if (0.001 <= dVar38) {
                dVar41 = dVar38;
              }
              dVar38 = 0.999999999999;
              if (pdVar17[uVar32] <= 0.999999999999) {
                dVar38 = pdVar17[uVar32];
              }
              dVar43 = 0.001;
              if (0.001 <= dVar38) {
                dVar43 = dVar38;
              }
              dVar38 = dVar43 * dVar37 + dVar41 * (1.0 - dVar37);
              pdVar15[uVar32] = dVar38 * dVar38;
              uVar32 = uVar32 + 1;
            } while (uVar24 != uVar32);
          }
        }
      }
      else if (-2 < iVar31) {
        pdVar16 = spectrogram[iVar30];
        pdVar17 = spectrogram[iVar8];
        uVar32 = 0;
        uVar42 = (ulong)DAT_0010c520;
        do {
          *(double *)((long)pvVar20 + uVar32 * 8) =
               (double)((ulong)pdVar16[uVar32] & uVar42) * (1.0 - dVar37) +
               (double)((ulong)pdVar17[uVar32] & uVar42) * dVar37;
          uVar32 = uVar32 + 1;
        } while (uVar24 != uVar32);
        goto LAB_0010a711;
      }
      if ((dVar36 <= 0.5) || (0.999 < *pdVar15)) {
        iVar30 = iVar31;
        if (0 < iVar31) {
          memset(pdVar14,0,uVar3 * 8);
        }
      }
      else {
        iVar30 = iVar31;
        if (-2 < local_148.fft_size) {
          lVar22 = -1;
          do {
            dVar37 = log((1.0 - pdVar15[lVar22 + 1]) * *(double *)((long)pvVar20 + lVar22 * 8 + 8) +
                         1e-12);
            local_148.log_spectrum[lVar22 + 1] = dVar37 * 0.5;
            lVar22 = lVar22 + 1;
          } while (lVar22 < local_148.fft_size / 2);
        }
        GetMinimumPhaseSpectrum(&local_148);
        if (-2 < iVar31) {
          lVar22 = 0;
          do {
            *(undefined8 *)((long)(double *)local_198._0_8_ + lVar22) =
                 *(undefined8 *)((long)*local_148.minimum_phase_spectrum + lVar22);
            *(undefined8 *)((long)(double *)local_198._0_8_ + lVar22 + 8) =
                 *(undefined8 *)((long)*local_148.minimum_phase_spectrum + lVar22 + 8);
            lVar22 = lVar22 + 0x10;
          } while (uVar24 << 4 != lVar22);
          dVar35 = (dVar35 * 6.283185307179586 * dVar46) / (double)iVar47;
          lVar22 = 0;
          uVar32 = 0;
          do {
            pdVar16 = (double *)((long)*(fft_complex *)local_198._0_8_ + lVar22);
            dVar44 = *pdVar16;
            in_stack_fffffffffffffd40 = (double *)pdVar16[1];
            dVar37 = cos((double)(int)uVar32 * dVar35);
            dVar38 = 1.0 - dVar37 * dVar37;
            if (dVar38 < 0.0) {
              dVar38 = sqrt(dVar38);
            }
            else {
              dVar38 = SQRT(dVar38);
            }
            pdVar16 = (double *)((long)(double *)local_198._0_8_ + lVar22);
            *pdVar16 = dVar37 * dVar44 + dVar38 * (double)in_stack_fffffffffffffd40;
            pdVar16[1] = dVar37 * (double)in_stack_fffffffffffffd40 + dVar38 * -dVar44;
            uVar32 = uVar32 + 1;
            lVar22 = lVar22 + 0x10;
          } while (uVar24 != uVar32);
        }
        puVar26 = (undefined8 *)(local_198 + 8);
        puVar28 = auStackY_328;
        iVar31 = iVar30;
        for (lVar22 = 9; lVar22 != 0; lVar22 = lVar22 + -1) {
          *puVar28 = *puVar26;
          puVar26 = puVar26 + (ulong)bVar34 * -2 + 1;
          puVar28 = puVar28 + (ulong)bVar34 * -2 + 1;
        }
        p.out = (double *)dVar35;
        p.n = in_stack_fffffffffffffd00._0_4_;
        p.sign = in_stack_fffffffffffffd00._4_4_;
        p.flags = in_stack_fffffffffffffd00._8_4_;
        p._12_4_ = in_stack_fffffffffffffd00._12_4_;
        p.c_in = (fft_complex *)in_stack_fffffffffffffd00._16_8_;
        p.in = (double *)in_stack_fffffffffffffd00._24_8_;
        p.c_out = (fft_complex *)in_stack_fffffffffffffd00._32_8_;
        p.input._0_4_ = iVar31;
        p.input._4_4_ = uVar48;
        p.ip = (int *)dVar44;
        p.w = in_stack_fffffffffffffd40;
        fft_execute(p);
        iVar30 = iVar31;
        fftshift((double *)local_1a8._8_8_,iVar31,pdVar14);
        if (0 < iVar31) {
          dVar35 = 0.0;
          uVar32 = uVar33;
          do {
            dVar35 = dVar35 + pdVar14[uVar32];
            uVar32 = uVar32 + 1;
          } while (uVar32 < uVar3);
          if (iVar31 != 1) {
            uVar32 = 0;
            do {
              pdVar14[uVar32] = *(double *)((long)pvVar19 + uVar32 * 8) * -dVar35;
              uVar32 = uVar32 + 1;
            } while (uVar33 != uVar32);
          }
          lVar22 = 0;
          do {
            pdVar14[uVar33 + lVar22] =
                 *(double *)((long)pvVar19 + lVar22 * 8 + uVar33 * 8) * -dVar35 +
                 pdVar14[uVar33 + lVar22];
            lVar22 = lVar22 + 1;
          } while ((int)((int)lVar22 + uVar6) < iVar31);
        }
      }
      uVar23 = iVar25 - iVar21;
      dVar35 = (double)(int)uVar23;
      if (0 < (int)uVar23) {
        dVar37 = 0.0;
        uVar32 = 0;
        iVar31 = iVar30;
        do {
          dVar44 = dVar37;
          dVar37 = randn(&local_1b8);
          *(double *)(local_98._8_8_ + uVar32 * 8) = dVar37;
          dVar37 = dVar44 + dVar37;
          uVar32 = uVar32 + 1;
        } while (uVar23 != uVar32);
        uVar32 = 0;
        do {
          *(double *)(local_98._8_8_ + uVar32 * 8) =
               *(double *)(local_98._8_8_ + uVar32 * 8) - dVar37 / dVar35;
          uVar32 = uVar32 + 1;
          iVar30 = iVar31;
        } while (uVar23 != uVar32);
      }
      if ((int)uVar23 < iVar31) {
        memset((double *)(local_98._8_8_ + (long)(int)uVar23 * 8),0,
               (ulong)(~uVar23 + iVar31) * 8 + 8);
      }
      puVar26 = (undefined8 *)(local_88 + 8);
      puVar28 = auStackY_328;
      for (lVar22 = 9; lVar22 != 0; lVar22 = lVar22 + -1) {
        *puVar28 = *puVar26;
        puVar26 = puVar26 + (ulong)bVar34 * -2 + 1;
        puVar28 = puVar28 + (ulong)bVar34 * -2 + 1;
      }
      p_00.out = (double *)dVar35;
      p_00.n = in_stack_fffffffffffffd00._0_4_;
      p_00.sign = in_stack_fffffffffffffd00._4_4_;
      p_00.flags = in_stack_fffffffffffffd00._8_4_;
      p_00._12_4_ = in_stack_fffffffffffffd00._12_4_;
      p_00.c_in = (fft_complex *)in_stack_fffffffffffffd00._16_8_;
      p_00.in = (double *)in_stack_fffffffffffffd00._24_8_;
      p_00.c_out = (fft_complex *)in_stack_fffffffffffffd00._32_8_;
      p_00.input._0_4_ = iVar30;
      p_00.input._4_4_ = uVar48;
      p_00.ip = (int *)dVar44;
      p_00.w = in_stack_fffffffffffffd40;
      fft_execute(p_00);
      if ((dVar36 != 0.0) || (NAN(dVar36))) {
        if (-2 < local_148.fft_size) {
          lVar22 = -1;
          do {
            dVar36 = log(*(double *)((long)pvVar20 + lVar22 * 8 + 8) * pdVar15[lVar22 + 1]);
            local_148.log_spectrum[lVar22 + 1] = dVar36 * 0.5;
            lVar22 = lVar22 + 1;
          } while (lVar22 < local_148.fft_size / 2);
        }
      }
      else if (-2 < local_148.fft_size) {
        lVar22 = -1;
        do {
          dVar36 = log(*(double *)((long)pvVar20 + lVar22 * 8 + 8));
          local_148.log_spectrum[lVar22 + 1] = dVar36 * 0.5;
          lVar22 = lVar22 + 1;
        } while (lVar22 < local_148.fft_size / 2);
      }
      GetMinimumPhaseSpectrum(&local_148);
      if (-2 < iVar31) {
        lVar22 = 0;
        do {
          *(double *)((long)(double *)local_198._0_8_ + lVar22) =
               *(double *)((long)*local_148.minimum_phase_spectrum + lVar22) *
               *(double *)((long)(double *)local_88._0_8_ + lVar22) -
               *(double *)((long)(double *)local_88._0_8_ + lVar22 + 8) *
               *(double *)((long)*local_148.minimum_phase_spectrum + lVar22 + 8);
          *(double *)((long)(double *)local_198._0_8_ + lVar22 + 8) =
               *(double *)((long)*local_148.minimum_phase_spectrum + lVar22) *
               *(double *)((long)(double *)local_88._0_8_ + lVar22 + 8) +
               *(double *)((long)*local_148.minimum_phase_spectrum + lVar22 + 8) *
               *(double *)((long)(double *)local_88._0_8_ + lVar22);
          lVar22 = lVar22 + 0x10;
        } while (uVar24 << 4 != lVar22);
      }
      puVar26 = (undefined8 *)(local_198 + 8);
      puVar28 = auStackY_328;
      for (lVar22 = 9; lVar22 != 0; lVar22 = lVar22 + -1) {
        *puVar28 = *puVar26;
        puVar26 = puVar26 + (ulong)bVar34 * -2 + 1;
        puVar28 = puVar28 + (ulong)bVar34 * -2 + 1;
      }
      p_01.out = (double *)dVar35;
      p_01.n = in_stack_fffffffffffffd00._0_4_;
      p_01.sign = in_stack_fffffffffffffd00._4_4_;
      p_01.flags = in_stack_fffffffffffffd00._8_4_;
      p_01._12_4_ = in_stack_fffffffffffffd00._12_4_;
      p_01.c_in = (fft_complex *)in_stack_fffffffffffffd00._16_8_;
      p_01.in = (double *)in_stack_fffffffffffffd00._24_8_;
      p_01.c_out = (fft_complex *)in_stack_fffffffffffffd00._32_8_;
      p_01.input._0_4_ = iVar30;
      p_01.input._4_4_ = uVar48;
      p_01.ip = (int *)dVar44;
      p_01.w = in_stack_fffffffffffffd40;
      fft_execute(p_01);
      fftshift((double *)local_1a8._8_8_,iVar31,pdVar13);
      if (dVar35 < 0.0) {
        dVar35 = sqrt(dVar35);
      }
      else {
        dVar35 = SQRT(dVar35);
      }
      if (0 < iVar31) {
        uVar32 = 0;
        do {
          *(double *)((long)pvVar9 + uVar32 * 8) =
               (pdVar14[uVar32] * dVar35 + pdVar13[uVar32]) / (double)iVar47;
          uVar32 = uVar32 + 1;
        } while (uVar3 != uVar32);
      }
      operator_delete__(pvVar20);
      operator_delete__(pdVar15);
      operator_delete__(pdVar14);
      operator_delete__(pdVar13);
      uVar23 = iVar21 + -uVar6;
      iVar21 = -uVar6 + iVar21 + 1;
      if (-2 < (int)uVar23) {
        uVar23 = 0xffffffff;
      }
      iVar25 = y_length - iVar21;
      if (iVar31 < y_length - iVar21) {
        iVar25 = iVar31;
      }
      if ((int)~uVar23 < iVar25) {
        uVar32 = (ulong)~uVar23;
        lVar22 = 0;
        do {
          y[(long)iVar21 + uVar32 + lVar22] =
               *(double *)((long)pvVar9 + lVar22 * 8 + uVar32 * 8) +
               y[(long)iVar21 + uVar32 + lVar22];
          lVar22 = lVar22 + 1;
        } while (uVar23 + iVar25 + 1 != (int)lVar22);
      }
      uVar32 = uVar1;
      iVar31 = iVar30;
    } while (uVar1 != uVar29);
  }
  operator_delete__(pvVar19);
  operator_delete__(pvVar10);
  operator_delete__(pvVar11);
  operator_delete__(pvVar12);
  operator_delete__(yi);
  DestroyMinimumPhaseAnalysis(&local_148);
  DestroyInverseRealFFT((InverseRealFFT *)local_1a8);
  DestroyForwardRealFFT((ForwardRealFFT *)local_98);
  operator_delete__(pvVar9);
  return;
}

Assistant:

void Synthesis(const double *f0, int f0_length,
    const double * const *spectrogram, const double * const *aperiodicity,
    int fft_size, double frame_period, int fs, int y_length, double *y) {
  RandnState randn_state = {};
  randn_reseed(&randn_state);

  double *impulse_response = new double[fft_size];

  for (int i = 0; i < y_length; ++i) y[i] = 0.0;

  MinimumPhaseAnalysis minimum_phase = {0};
  InitializeMinimumPhaseAnalysis(fft_size, &minimum_phase);
  InverseRealFFT inverse_real_fft = {0};
  InitializeInverseRealFFT(fft_size, &inverse_real_fft);
  ForwardRealFFT forward_real_fft = {0};
  InitializeForwardRealFFT(fft_size, &forward_real_fft);

  double *pulse_locations = new double[y_length];
  int *pulse_locations_index = new int[y_length];
  double *pulse_locations_time_shift = new double[y_length];
  double *interpolated_vuv = new double[y_length];
  int number_of_pulses = GetTimeBase(f0, f0_length, fs, frame_period / 1000.0,
      y_length, fs / fft_size + 1.0, pulse_locations, pulse_locations_index,
      pulse_locations_time_shift, interpolated_vuv);

  double *dc_remover = new double[fft_size];
  GetDCRemover(fft_size, dc_remover);

  frame_period /= 1000.0;
  int noise_size;
  int index, offset, lower_limit, upper_limit;
  for (int i = 0; i < number_of_pulses; ++i) {
    noise_size = pulse_locations_index[MyMinInt(number_of_pulses - 1, i + 1)] -
      pulse_locations_index[i];

    GetOneFrameSegment(interpolated_vuv[pulse_locations_index[i]], noise_size,
        spectrogram, fft_size, aperiodicity, f0_length, frame_period,
        pulse_locations[i], pulse_locations_time_shift[i], fs,
        &forward_real_fft, &inverse_real_fft, &minimum_phase, dc_remover,
        impulse_response, &randn_state);
    offset = pulse_locations_index[i] - fft_size / 2 + 1;
    lower_limit = MyMaxInt(0, -offset);
    upper_limit = MyMinInt(fft_size, y_length - offset);
    for (int j = lower_limit; j < upper_limit; ++j) {
      index = j + offset;
      y[index] += impulse_response[j];
    }
  }

  delete[] dc_remover;
  delete[] pulse_locations;
  delete[] pulse_locations_index;
  delete[] pulse_locations_time_shift;
  delete[] interpolated_vuv;

  DestroyMinimumPhaseAnalysis(&minimum_phase);
  DestroyInverseRealFFT(&inverse_real_fft);
  DestroyForwardRealFFT(&forward_real_fft);

  delete[] impulse_response;
}